

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandCycle(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_NtkType_t AVar1;
  bool bVar2;
  int iVar3;
  uint nFrames;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  uint fVerbose;
  int iVar5;
  char *pcVar6;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  bVar2 = false;
  Extra_UtilGetoptReset();
  nFrames = 100;
  fVerbose = 0;
LAB_00269a19:
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"Fxvh"), iVar5 = globalUtilOptind, iVar3 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar3 == -1) {
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar4 = "Empty network.\n";
      }
      else {
        AVar1 = pNtk->ntkType;
        if ((AVar1 == ABC_NTK_STRASH) ||
           ((AVar1 == ABC_NTK_LOGIC && (pNtk->ntkFunc == ABC_FUNC_SOP)))) {
          if (pNtk->nObjCounts[8] == 0) {
            pcVar4 = "The network is combinational.\n";
LAB_00269b06:
            Abc_Print(-1,pcVar4);
            return 0;
          }
          if (bVar2) {
            if (AVar1 != ABC_NTK_STRASH) {
              pcVar4 = "X-valued simulation only works for AIGs. Run \"strash\".\n";
              goto LAB_00269b06;
            }
            Abc_NtkCycleInitState(pNtk,nFrames,1,fVerbose);
          }
          else {
            if (AVar1 == ABC_NTK_STRASH) {
              Abc_NtkCycleInitState(pNtk,nFrames,0,fVerbose);
              return 0;
            }
            Abc_NtkCycleInitStateSop(pNtk,nFrames,fVerbose);
          }
          return 0;
        }
        pcVar4 = "Only works for strashed networks or logic SOP networks.\n";
      }
      iVar5 = -1;
      goto LAB_00269be4;
    }
    if (iVar3 == 0x78) {
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_00269a19;
    }
    if (iVar3 != 0x46) goto LAB_00269b43;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      goto LAB_00269b43;
    }
    nFrames = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if ((int)nFrames < 0) {
LAB_00269b43:
      Abc_Print(-2,"usage: cycle [-F num] [-xvh]\n");
      Abc_Print(-2,"\t         cycles sequential circuit for the given number of timeframes\n");
      Abc_Print(-2,"\t         to derive a new initial state (which may be on the envelope)\n");
      Abc_Print(-2,"\t-F num : the number of frames to simulate [default = %d]\n",(ulong)nFrames);
      pcVar6 = "yes";
      pcVar4 = "yes";
      if (!bVar2) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-x     : use x-valued primary inputs [default = %s]\n",pcVar4);
      if (fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar5 = -2;
LAB_00269be4:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandCycle( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int nFrames;
    int fUseXval;
    int fVerbose;
    extern void Abc_NtkCycleInitState( Abc_Ntk_t * pNtk, int nFrames, int fUseXval, int fVerbose );
    extern void Abc_NtkCycleInitStateSop( Abc_Ntk_t * pNtk, int nFrames, int fVerbose );
    // set defaults
    nFrames    = 100;
    fUseXval   =   0;
    fVerbose   =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fxvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'x':
            fUseXval ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) && !Abc_NtkIsSopLogic(pNtk) )
    {
        Abc_Print( -1, "Only works for strashed networks or logic SOP networks.\n" );
        return 1;
    }
    if ( !Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( fUseXval && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "X-valued simulation only works for AIGs. Run \"strash\".\n" );
        return 0;
    }
    if ( fUseXval )
        Abc_NtkCycleInitState( pNtk, nFrames, 1, fVerbose );
    else if ( Abc_NtkIsStrash(pNtk) )
        Abc_NtkCycleInitState( pNtk, nFrames, 0, fVerbose );
    else
        Abc_NtkCycleInitStateSop( pNtk, nFrames, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: cycle [-F num] [-xvh]\n" );
    Abc_Print( -2, "\t         cycles sequential circuit for the given number of timeframes\n" );
    Abc_Print( -2, "\t         to derive a new initial state (which may be on the envelope)\n" );
    Abc_Print( -2, "\t-F num : the number of frames to simulate [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-x     : use x-valued primary inputs [default = %s]\n", fUseXval? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}